

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btStaticPlaneShape.h
# Opt level: O3

char * __thiscall
btStaticPlaneShape::serialize(btStaticPlaneShape *this,void *dataBuffer,btSerializer *serializer)

{
  int i;
  long lVar1;
  
  btCollisionShape::serialize((btCollisionShape *)this,dataBuffer,serializer);
  lVar1 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar1 * 4 + 0x10) = (this->m_localScaling).m_floats[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  lVar1 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar1 * 4 + 0x20) = (this->m_planeNormal).m_floats[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  *(btScalar *)((long)dataBuffer + 0x30) = this->m_planeConstant;
  return "btStaticPlaneShapeData";
}

Assistant:

SIMD_FORCE_INLINE	const char*	btStaticPlaneShape::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btStaticPlaneShapeData* planeData = (btStaticPlaneShapeData*) dataBuffer;
	btCollisionShape::serialize(&planeData->m_collisionShapeData,serializer);

	m_localScaling.serializeFloat(planeData->m_localScaling);
	m_planeNormal.serializeFloat(planeData->m_planeNormal);
	planeData->m_planeConstant = float(m_planeConstant);
		
	return "btStaticPlaneShapeData";
}